

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

int N_VWrmsNormVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,realtype *nrm)

{
  int iVar1;
  long lVar2;
  long lVar3;
  realtype *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  realtype rVar4;
  realtype *xd;
  realtype *wd;
  sunindextype N;
  sunindextype j;
  int i;
  N_Vector in_stack_ffffffffffffffb8;
  double dVar5;
  int local_28;
  int local_24;
  int local_4;
  
  if (in_EDI < 1) {
    local_4 = -1;
  }
  else if (in_EDI == 1) {
    rVar4 = N_VWrmsNorm_Serial((N_Vector)0x0,in_stack_ffffffffffffffb8);
    *in_RCX = rVar4;
    local_4 = 0;
  }
  else {
    iVar1 = **(int **)*in_RSI;
    for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
      lVar2 = *(long *)(*(long *)in_RSI[local_24] + 8);
      lVar3 = *(long *)(**(long **)(in_RDX + (long)local_24 * 8) + 8);
      in_RCX[local_24] = 0.0;
      for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
        in_RCX[local_24] =
             *(double *)(lVar2 + (long)local_28 * 8) * *(double *)(lVar3 + (long)local_28 * 8) *
             *(double *)(lVar2 + (long)local_28 * 8) * *(double *)(lVar3 + (long)local_28 * 8) +
             in_RCX[local_24];
      }
      if (0.0 < in_RCX[local_24] / (double)iVar1) {
        dVar5 = sqrt(in_RCX[local_24] / (double)iVar1);
      }
      else {
        dVar5 = 0.0;
      }
      in_RCX[local_24] = dVar5;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int N_VWrmsNormVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                  realtype* nrm)
{
  int          i;
  sunindextype j, N;
  realtype*    wd=NULL;
  realtype*    xd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VWrmsNorm */
  if (nvec == 1) {
    nrm[0] = N_VWrmsNorm_Serial(X[0], W[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /* compute the WRMS norm for each vector in the vector array */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    wd = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j=0; j<N; j++) {
      nrm[i] += SUNSQR(xd[j] * wd[j]);
    }
    nrm[i] = SUNRsqrt(nrm[i]/N);
  }

  return(0);
}